

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O3

int cfg_cmd_handle_load(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  cfg_db *src;
  
  src = cfg_io_load(instance,arg,log);
  if (src != (cfg_db *)0x0) {
    _cfg_db_append(db,src,(char *)0x0,(char *)0x0,(char *)0x0);
    cfg_db_remove(src);
  }
  return -(uint)(src == (cfg_db *)0x0);
}

Assistant:

int
cfg_cmd_handle_load(struct cfg_instance *instance, struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct cfg_db *temp_db;

  temp_db = cfg_io_load(instance, arg, log);
  if (temp_db != NULL) {
    cfg_db_copy(db, temp_db);
    cfg_db_remove(temp_db);
  }
  return temp_db != NULL ? 0 : -1;
}